

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_hand.cc
# Opt level: O2

void __thiscall
hanabi_learning_env::HanabiHand::ValueKnowledge::ApplyIsNotValueHint(ValueKnowledge *this,int value)

{
  uint __line;
  char *__assertion;
  reference rVar1;
  
  if ((value < 0) ||
     ((ulong)(this->value_plausible_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
      ((long)(this->value_plausible_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
      (long)(this->value_plausible_).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 <=
      (ulong)(uint)value)) {
    __assertion = "value >= 0 && value < value_plausible_.size()";
    __line = 0x27;
  }
  else {
    if (this->value_ != value || this->value_ < 0) {
      rVar1 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (&this->value_plausible_,(ulong)(uint)value);
      *rVar1._M_p = *rVar1._M_p & ~rVar1._M_mask;
      return;
    }
    __assertion = "value_ < 0 || value_ != value";
    __line = 0x28;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jtwwang[P]hanabi/hanabi_lib/hanabi_hand.cc"
                ,__line,
                "void hanabi_learning_env::HanabiHand::ValueKnowledge::ApplyIsNotValueHint(int)");
}

Assistant:

void HanabiHand::ValueKnowledge::ApplyIsNotValueHint(int value) {
  assert(value >= 0 && value < value_plausible_.size());
  assert(value_ < 0 || value_ != value);
  value_plausible_[value] = false;
}